

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

xml_attribute __thiscall
pugi::xml_node::attribute(xml_node *this,char_t *name_,xml_attribute *hint_)

{
  xml_attribute_struct *attr;
  xml_node_struct *node;
  bool bVar1;
  xml_attribute_struct *pxVar2;
  xml_attribute_struct **ppxVar3;
  xml_attribute local_30;
  
  attr = hint_->_attr;
  node = this->_root;
  pxVar2 = attr;
  if (attr == (xml_attribute_struct *)0x0) {
    if (node == (xml_node_struct *)0x0) goto LAB_0019b006;
  }
  else if ((node == (xml_node_struct *)0x0) ||
          (bVar1 = impl::anon_unknown_0::is_attribute_of(attr,node), !bVar1)) {
    __assert_fail("!hint || (_root && impl::is_attribute_of(hint, _root))",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/pugixml.cpp"
                  ,0x1656,
                  "xml_attribute pugi::xml_node::attribute(const char_t *, xml_attribute &) const");
  }
  for (; pxVar2 != (xml_attribute_struct *)0x0; pxVar2 = pxVar2->next_attribute) {
    if ((pxVar2->name != (char_t *)0x0) &&
       (bVar1 = impl::anon_unknown_0::strequal(name_,pxVar2->name), bVar1)) {
      hint_->_attr = pxVar2->next_attribute;
      goto LAB_0019b033;
    }
  }
  ppxVar3 = &this->_root->first_attribute;
  while ((pxVar2 = *ppxVar3, pxVar2 != (xml_attribute_struct *)0x0 && (pxVar2 != attr))) {
    if ((pxVar2->name != (char_t *)0x0) &&
       (bVar1 = impl::anon_unknown_0::strequal(name_,pxVar2->name), bVar1)) {
      hint_->_attr = pxVar2->next_attribute;
LAB_0019b033:
      xml_attribute::xml_attribute(&local_30,pxVar2);
      return (xml_attribute)local_30._attr;
    }
    ppxVar3 = &pxVar2->next_attribute;
  }
LAB_0019b006:
  xml_attribute::xml_attribute(&local_30);
  return (xml_attribute)local_30._attr;
}

Assistant:

PUGI_IMPL_FN xml_attribute xml_node::attribute(const char_t* name_, xml_attribute& hint_) const
	{
		xml_attribute_struct* hint = hint_._attr;

		// if hint is not an attribute of node, behavior is not defined
		assert(!hint || (_root && impl::is_attribute_of(hint, _root)));

		if (!_root) return xml_attribute();

		// optimistically search from hint up until the end
		for (xml_attribute_struct* i = hint; i; i = i->next_attribute)
		{
			const char_t* iname = i->name;
			if (iname && impl::strequal(name_, iname))
			{
				// update hint to maximize efficiency of searching for consecutive attributes
				hint_._attr = i->next_attribute;

				return xml_attribute(i);
			}
		}

		// wrap around and search from the first attribute until the hint
		// 'j' null pointer check is technically redundant, but it prevents a crash in case the assertion above fails
		for (xml_attribute_struct* j = _root->first_attribute; j && j != hint; j = j->next_attribute)
		{
			const char_t* jname = j->name;
			if (jname && impl::strequal(name_, jname))
			{
				// update hint to maximize efficiency of searching for consecutive attributes
				hint_._attr = j->next_attribute;

				return xml_attribute(j);
			}
		}

		return xml_attribute();
	}